

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_TruthCofactor0New(uint *pOut,uint *pIn,int nVars,int iVar)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int local_2c;
  int Step;
  int k;
  int i;
  int nWords;
  int iVar_local;
  int nVars_local;
  uint *pIn_local;
  uint *pOut_local;
  
  iVar2 = Kit_TruthWordNum(nVars);
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x20e,"void Kit_TruthCofactor0New(unsigned int *, unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    for (Step = 0; Step < iVar2; Step = Step + 1) {
      pOut[Step] = pIn[Step] & 0x55555555 | (pIn[Step] & 0x55555555) << 1;
    }
    break;
  case 1:
    for (Step = 0; Step < iVar2; Step = Step + 1) {
      pOut[Step] = pIn[Step] & 0x33333333 | (pIn[Step] & 0x33333333) << 2;
    }
    break;
  case 2:
    for (Step = 0; Step < iVar2; Step = Step + 1) {
      pOut[Step] = pIn[Step] & 0xf0f0f0f | (pIn[Step] & 0xf0f0f0f) << 4;
    }
    break;
  case 3:
    for (Step = 0; Step < iVar2; Step = Step + 1) {
      pOut[Step] = pIn[Step] & 0xff00ff | (pIn[Step] & 0xff00ff) << 8;
    }
    break;
  case 4:
    for (Step = 0; Step < iVar2; Step = Step + 1) {
      pOut[Step] = pIn[Step] & 0xffff | pIn[Step] << 0x10;
    }
    break;
  default:
    iVar3 = 1 << ((char)iVar - 5U & 0x1f);
    _iVar_local = pIn;
    pIn_local = pOut;
    for (local_2c = 0; local_2c < iVar2; local_2c = iVar3 * 2 + local_2c) {
      for (Step = 0; Step < iVar3; Step = Step + 1) {
        uVar1 = _iVar_local[Step];
        pIn_local[iVar3 + Step] = uVar1;
        pIn_local[Step] = uVar1;
      }
      _iVar_local = _iVar_local + (iVar3 << 1);
      pIn_local = pIn_local + (iVar3 << 1);
    }
  }
  return;
}

Assistant:

void Kit_TruthCofactor0New( unsigned * pOut, unsigned * pIn, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x55555555) | ((pIn[i] & 0x55555555) << 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x33333333) | ((pIn[i] & 0x33333333) << 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x0F0F0F0F) | ((pIn[i] & 0x0F0F0F0F) << 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x00FF00FF) | ((pIn[i] & 0x00FF00FF) << 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x0000FFFF) | ((pIn[i] & 0x0000FFFF) << 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pOut[Step+i] = pIn[i];
            pIn += 2*Step;
            pOut += 2*Step;
        }
        return;
    }
}